

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportedUgridFactory.h
# Opt level: O1

void Parfait::ImportedUgridFactory::createBoundaryConditionsFromTags
               (string *filename,vector<int,_std::allocator<int>_> *triangleTags,
               vector<int,_std::allocator<int>_> *quadTags,
               vector<int,_std::allocator<int>_> *triangleBoundaryConditions,
               vector<int,_std::allocator<int>_> *quadBoundaryConditions)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  pointer piVar3;
  int *piVar4;
  iterator iVar5;
  long lVar6;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  _Base_ptr p_Var9;
  int *piVar10;
  string mapbcFile;
  MapbcReader reader;
  int local_d4;
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  vector<int,_std::allocator<int>_> *local_b0;
  string local_a8;
  MapbcReader local_88;
  
  local_d0 = local_c0;
  pcVar2 = (filename->_M_dataplus)._M_p;
  local_b0 = quadTags;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar2,pcVar2 + filename->_M_string_length);
  std::__cxx11::string::resize((ulong)&local_d0,(char)filename->_M_string_length + -5);
  lVar6 = std::__cxx11::string::find((char *)&local_d0,0x10e290,0);
  if (lVar6 != -1) {
    std::__cxx11::string::resize((ulong)&local_d0,(char)lVar6);
  }
  lVar6 = std::__cxx11::string::find((char *)&local_d0,0x10e1dd,0);
  if (lVar6 != -1) {
    std::__cxx11::string::resize((ulong)&local_d0,(char)lVar6);
  }
  std::__cxx11::string::append((char *)&local_d0);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_a8,local_d0,local_c8 + (long)local_d0);
  MapbcReader::MapbcReader(&local_88,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  piVar3 = (triangleBoundaryConditions->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((triangleBoundaryConditions->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish != piVar3) {
    (triangleBoundaryConditions->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = piVar3;
  }
  std::vector<int,_std::allocator<int>_>::reserve
            (triangleBoundaryConditions,
             (long)(triangleTags->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(triangleTags->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  piVar3 = (quadBoundaryConditions->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((quadBoundaryConditions->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish != piVar3) {
    (quadBoundaryConditions->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = piVar3;
  }
  std::vector<int,_std::allocator<int>_>::reserve
            (quadBoundaryConditions,
             (long)(local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  piVar10 = (triangleTags->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  piVar4 = (triangleTags->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar10 != piVar4) {
    p_Var1 = &local_88.bcMap._M_t._M_impl.super__Rb_tree_header;
    do {
      local_d4 = *piVar10;
      p_Var7 = &p_Var1->_M_header;
      p_Var9 = local_88.bcMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (local_88.failedToOpenMapbc == false) {
        for (; (_Rb_tree_header *)p_Var9 != (_Rb_tree_header *)0x0;
            p_Var9 = (&p_Var9->_M_left)[(int)*(size_t *)(p_Var9 + 1) < local_d4]) {
          if (local_d4 <= (int)*(size_t *)(p_Var9 + 1)) {
            p_Var7 = p_Var9;
          }
        }
        p_Var8 = p_Var1;
        if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
           (p_Var8 = (_Rb_tree_header *)p_Var7,
           local_d4 < (int)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
          p_Var8 = p_Var1;
        }
        local_d4 = *(int *)(p_Var8 + 1);
      }
      iVar5._M_current =
           (triangleBoundaryConditions->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (triangleBoundaryConditions->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (triangleBoundaryConditions,iVar5,&local_d4);
      }
      else {
        *iVar5._M_current = local_d4;
        (triangleBoundaryConditions->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      piVar10 = piVar10 + 1;
    } while (piVar10 != piVar4);
  }
  piVar10 = (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  piVar4 = (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  if (piVar10 != piVar4) {
    p_Var1 = &local_88.bcMap._M_t._M_impl.super__Rb_tree_header;
    do {
      local_d4 = *piVar10;
      p_Var7 = &p_Var1->_M_header;
      p_Var9 = local_88.bcMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (local_88.failedToOpenMapbc == false) {
        for (; p_Var9 != (_Base_ptr)0x0;
            p_Var9 = (&p_Var9->_M_left)[(int)p_Var9[1]._M_color < local_d4]) {
          if (local_d4 <= (int)p_Var9[1]._M_color) {
            p_Var7 = p_Var9;
          }
        }
        p_Var9 = &p_Var1->_M_header;
        if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
           (p_Var9 = p_Var7, local_d4 < (int)p_Var7[1]._M_color)) {
          p_Var9 = &p_Var1->_M_header;
        }
        local_d4 = *(int *)&p_Var9[1]._M_parent;
      }
      iVar5._M_current =
           (quadBoundaryConditions->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (quadBoundaryConditions->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (quadBoundaryConditions,iVar5,&local_d4);
      }
      else {
        *iVar5._M_current = local_d4;
        (quadBoundaryConditions->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      piVar10 = piVar10 + 1;
    } while (piVar10 != piVar4);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Rb_tree(&local_88.bcMap._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.filename._M_dataplus._M_p != &local_88.filename.field_2) {
    operator_delete(local_88.filename._M_dataplus._M_p,
                    local_88.filename.field_2._M_allocated_capacity + 1);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  return;
}

Assistant:

inline void ImportedUgridFactory::createBoundaryConditionsFromTags(
            std::string filename,
            std::vector<int> &triangleTags,
            std::vector<int> &quadTags,
            std::vector<int> &triangleBoundaryConditions,
            std::vector<int> &quadBoundaryConditions
    ) {

        std::string mapbcFile = filename;
        mapbcFile.resize(filename.size() - 5);
        auto position = mapbcFile.find("lb8.");
        if (std::string::npos != position)
            mapbcFile.resize(position);
        position = mapbcFile.find("b8.");
        if (std::string::npos != position)
            mapbcFile.resize(position);
        mapbcFile += "mapbc";
        MapbcReader reader(mapbcFile);

        triangleBoundaryConditions.clear();
        triangleBoundaryConditions.reserve(triangleTags.size());
        quadBoundaryConditions.clear();
        quadBoundaryConditions.reserve(quadTags.size());

        for (int tag:triangleTags)
            triangleBoundaryConditions.push_back(reader.boundaryCondition(tag));
        for (int tag:quadTags)
            quadBoundaryConditions.push_back(reader.boundaryCondition(tag));
    }